

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O2

void __thiscall
fizplex::Simplex::exchange_base_column(Simplex *this,Candidate candidate,RatioTestResult rt)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  double *pdVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  Debug *pDVar7;
  Debug local_28;
  
  pdVar5 = DVector::operator[](&this->x,(this->basic_indices).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start[rt.leaving_index])
  ;
  *pdVar5 = rt.leaving_bound;
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    ((this->non_basic_indices).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->non_basic_indices).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,&candidate.index);
  if (_Var6._M_current !=
      (this->non_basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = (this->non_basic_indices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_28.out = (ostream *)&std::cerr;
    local_28.print = false;
    pDVar7 = Debug::operator<<(&local_28,"Leaving: ");
    pDVar7 = Debug::operator<<(pDVar7,(this->basic_indices).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start[rt.leaving_index]);
    pDVar7 = Debug::operator<<(pDVar7,", Entering: ");
    pDVar7 = Debug::operator<<(pDVar7,*(_Var6._M_current +
                                       ((long)(this->non_basic_indices).
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)puVar1)));
    Debug::operator<<(pDVar7,"\n");
    puVar2 = (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->non_basic_indices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = *(_Var6._M_current + ((long)puVar3 - (long)puVar1));
    *(_Var6._M_current + ((long)puVar3 - (long)puVar1)) = puVar2[rt.leaving_index];
    puVar2[rt.leaving_index] = uVar4;
    return;
  }
  __assert_fail("it != non_basic_indices.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                ,0xa5,"void fizplex::Simplex::exchange_base_column(Candidate, RatioTestResult)");
}

Assistant:

void Simplex::exchange_base_column(Candidate candidate, RatioTestResult rt) {
  x[basic_indices[rt.leaving_index]] = rt.leaving_bound;
  const auto it = std::find(non_basic_indices.begin(), non_basic_indices.end(),
                            candidate.index);

  assert(it != non_basic_indices.end());
  const size_t candidate_non_basic_index =
      std::distance(non_basic_indices.begin(), it);

  Debug(1) << "Leaving: " << basic_indices[rt.leaving_index]
           << ", Entering: " << non_basic_indices[candidate_non_basic_index]
           << "\n";
  std::swap<size_t>(non_basic_indices[candidate_non_basic_index],
                    basic_indices[rt.leaving_index]);
}